

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O2

void lj_lib_register(lua_State *L,char *libname,uint8_t *p,lua_CFunction *cf)

{
  byte *str;
  byte bVar1;
  byte bVar2;
  uint64_t uVar3;
  char *pcVar4;
  GCproto *pt;
  GCfunc *pGVar5;
  GCstr *pGVar6;
  TValue TVar7;
  long lVar8;
  MSize nelems;
  byte *pbVar9;
  ulong uVar10;
  GCtab *t;
  TValue *pTVar11;
  uint uVar12;
  uint uVar13;
  uint8_t local_121;
  GCfunc *local_120;
  uint64_t local_118;
  TValue *local_108;
  GCtab *local_100;
  LexState local_e8;
  
  local_118 = (L->glref).ptr64;
  local_100 = (GCtab *)(L->env).gcptr64;
  local_121 = *p;
  bVar1 = p[1];
  bVar2 = p[2];
  if (libname == (char *)0x0) {
    lua_createtable(L,0,(uint)bVar2);
  }
  else {
    luaL_findtable(L,-10000,"_LOADED",0x10);
    lua_getfield(L,-1,libname);
    pTVar11 = L->top;
    if ((pTVar11[-1].u64 & 0xffff800000000000) != 0xfffa000000000000) {
      L->top = pTVar11 + -1;
      pcVar4 = luaL_findtable(L,-0x2712,libname,(uint)bVar2);
      if (pcVar4 != (char *)0x0) {
        lj_err_callerv(L,LJ_ERR_BADMODN,libname);
      }
      L->top->u64 = L->top[-1].u64 & 0x7fffffffffff | 0xfffa000000000000;
      L->top = L->top + 1;
      lua_setfield(L,-3,libname);
      pTVar11 = L->top;
    }
    L->top = pTVar11 + -1;
    pTVar11[-2].u64 = pTVar11[-1].u64 & 0x7fffffffffff | 0xfffa000000000000;
  }
  t = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
  lVar8 = (long)L->top - (long)L->base;
  if ((t->marked & 4) != 0) {
    uVar3 = (L->glref).ptr64;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr64 = *(uint64_t *)(uVar3 + 0x40);
    *(GCtab **)(uVar3 + 0x40) = t;
  }
  local_118 = (ulong)bVar1 * 4 + 0x1718 + local_118;
  t->nomm = '\0';
  local_120 = (GCfunc *)0x0;
  pbVar9 = p + 3;
  local_108 = (TValue *)cf;
LAB_00115a9e:
  while( true ) {
    str = pbVar9 + 1;
    bVar1 = *pbVar9;
    uVar13 = bVar1 & 0x3f;
    uVar12 = bVar1 & 0xffffffc0;
    if (uVar12 == 0xc0) break;
    uVar10 = ((ulong)((long)L->top - (long)L->base) >> 3) - (lVar8 >> 3);
    nelems = (MSize)uVar10;
    pGVar5 = lj_func_newC(L,nelems,local_100);
    if (nelems != 0) {
      pTVar11 = (TValue *)((long)L->base + lVar8);
      L->top = pTVar11;
      memcpy((pGVar5->c).upvalue,pTVar11,(uVar10 & 0xffffffff) << 3);
    }
    (pGVar5->c).ffid = local_121;
    if ((bVar1 & 0xc0) == 0) {
      (pGVar5->c).pc.ptr64 = (L->glref).ptr64 + 0x168;
LAB_00115c17:
      pTVar11 = local_108;
      local_108 = local_108 + 1;
    }
    else {
      (pGVar5->c).pc.ptr64 = local_118;
      local_118 = local_118 + 4;
      if (uVar12 != 0x80) goto LAB_00115c17;
      pTVar11 = (TValue *)&(local_120->c).f;
    }
    local_121 = local_121 + '\x01';
    (pGVar5->c).f = (lua_CFunction)*pTVar11;
    pbVar9 = str + uVar13;
    local_120 = pGVar5;
    if ((bVar1 & 0x3f) != 0) {
      pGVar6 = lj_str_new(L,(char *)str,(ulong)uVar13);
      pTVar11 = lj_tab_setstr(L,t,pGVar6);
      pTVar11->u64 = (ulong)pGVar5 | 0xfffb800000000000;
    }
  }
  switch(bVar1) {
  case 0xf9:
    bVar1 = pbVar9[1];
    pGVar6 = lj_str_new(L,(char *)(pbVar9 + 2),(ulong)bVar1);
    memset(&local_e8,0,0xb8);
    local_e8.p = (char *)(pbVar9 + (ulong)bVar1 + 2);
    local_e8.pe = (char *)0xffffffffffffffff;
    local_e8.c = -1;
    local_e8.level = 2;
    local_e8.L = L;
    local_e8.chunkname = pGVar6;
    pt = lj_bcread_proto(&local_e8);
    pt->firstline = -1;
    pGVar5 = lj_func_newL_empty(L,pt,(GCtab *)(L->env).gcptr64);
    pTVar11 = lj_tab_setstr(L,t,pGVar6);
    pTVar11->u64 = (ulong)pGVar5 | 0xfffb800000000000;
    pbVar9 = (byte *)local_e8.p;
    goto LAB_00115a9e;
  case 0xfa:
    pTVar11 = L->top;
    L->top = pTVar11 + -2;
    if (((pTVar11[-1].u64 & 0xffff800000000000) == 0xfffd800000000000) &&
       (*(int *)((pTVar11[-1].u64 & 0x7fffffffffff) + 0x14) == 0)) {
      local_100 = (GCtab *)(pTVar11[-2].u64 & 0x7fffffffffff);
      pbVar9 = str;
      goto LAB_00115a9e;
    }
    pTVar11 = lj_tab_set(L,t,pTVar11 + -1);
    TVar7 = *L->top;
    break;
  case 0xfb:
    *L->top = *(TValue *)(pbVar9 + 1);
    L->top = L->top + 1;
    pbVar9 = pbVar9 + 9;
    goto LAB_00115a9e;
  case 0xfc:
    *L->top = L->top[-(ulong)pbVar9[1]];
    L->top = L->top + 1;
    pbVar9 = pbVar9 + 2;
    goto LAB_00115a9e;
  case 0xfd:
    pTVar11 = L->top;
    L->top = pTVar11 + 1;
    TVar7.u64 = (ulong)local_120 | 0xfffb800000000000;
    break;
  case 0xfe:
    local_121 = local_121 + '\x01';
    pbVar9 = str;
    goto LAB_00115a9e;
  case 0xff:
    return;
  default:
    goto switchD_00115ae8_default;
  }
  pTVar11->u64 = (uint64_t)TVar7;
  pbVar9 = str;
  goto LAB_00115a9e;
switchD_00115ae8_default:
  pTVar11 = L->top;
  L->top = pTVar11 + 1;
  pGVar6 = lj_str_new(L,(char *)str,(ulong)uVar13);
  pTVar11->u64 = (ulong)pGVar6 | 0xfffd800000000000;
  pbVar9 = str + uVar13;
  goto LAB_00115a9e;
}

Assistant:

void lj_lib_register(lua_State *L, const char *libname,
		     const uint8_t *p, const lua_CFunction *cf)
{
  GCtab *env = tabref(L->env);
  GCfunc *ofn = NULL;
  int ffid = *p++;
  BCIns *bcff = &L2GG(L)->bcff[*p++];
  GCtab *tab = lib_create_table(L, libname, *p++);
  ptrdiff_t tpos = L->top - L->base;

  /* Avoid barriers further down. */
  lj_gc_anybarriert(L, tab);
  tab->nomm = 0;

  for (;;) {
    uint32_t tag = *p++;
    MSize len = tag & LIBINIT_LENMASK;
    tag &= LIBINIT_TAGMASK;
    if (tag != LIBINIT_STRING) {
      const char *name;
      MSize nuv = (MSize)(L->top - L->base - tpos);
      GCfunc *fn = lj_func_newC(L, nuv, env);
      if (nuv) {
	L->top = L->base + tpos;
	memcpy(fn->c.upvalue, L->top, sizeof(TValue)*nuv);
      }
      fn->c.ffid = (uint8_t)(ffid++);
      name = (const char *)p;
      p += len;
      if (tag == LIBINIT_CF)
	setmref(fn->c.pc, &G(L)->bc_cfunc_int);
      else
	setmref(fn->c.pc, bcff++);
      if (tag == LIBINIT_ASM_)
	fn->c.f = ofn->c.f;  /* Copy handler from previous function. */
      else
	fn->c.f = *cf++;  /* Get cf or handler from C function table. */
      if (len) {
	/* NOBARRIER: See above for common barrier. */
	setfuncV(L, lj_tab_setstr(L, tab, lj_str_new(L, name, len)), fn);
      }
      ofn = fn;
    } else {
      switch (tag | len) {
      case LIBINIT_LUA:
	p = lib_read_lfunc(L, p, tab);
	break;
      case LIBINIT_SET:
	L->top -= 2;
	if (tvisstr(L->top+1) && strV(L->top+1)->len == 0)
	  env = tabV(L->top);
	else  /* NOBARRIER: See above for common barrier. */
	  copyTV(L, lj_tab_set(L, tab, L->top+1), L->top);
	break;
      case LIBINIT_NUMBER:
	memcpy(&L->top->n, p, sizeof(double));
	L->top++;
	p += sizeof(double);
	break;
      case LIBINIT_COPY:
	copyTV(L, L->top, L->top - *p++);
	L->top++;
	break;
      case LIBINIT_LASTCL:
	setfuncV(L, L->top++, ofn);
	break;
      case LIBINIT_FFID:
	ffid++;
	break;
      case LIBINIT_END:
	return;
      default:
	setstrV(L, L->top++, lj_str_new(L, (const char *)p, len));
	p += len;
	break;
      }
    }
  }
}